

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_67a627::SourceLineSynchronizer::syncToMostRecentString
          (SourceLineSynchronizer *this)

{
  int iVar1;
  SourceLineSynchronizer *this_local;
  
  iVar1 = std::function<int_()>::operator()(&this->getLastSourceIndex);
  if (iVar1 == this->lastSource) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->lastSource != -1) || (this->lastLine != 0)) {
      std::__cxx11::string::operator+=((string *)this->output,'\n');
    }
    iVar1 = std::function<int_()>::operator()(&this->getLastSourceIndex);
    this->lastSource = iVar1;
    this->lastLine = -1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool syncToMostRecentString() {
        if (getLastSourceIndex() != lastSource) {
            // After switching to a new source string, we need to reset lastLine
            // because line number resets every time a new source string is
            // used. We also need to output a newline to separate the output
            // from the previous source string (if there is one).
            if (lastSource != -1 || lastLine != 0)
                *output += '\n';
            lastSource = getLastSourceIndex();
            lastLine = -1;
            return true;
        }
        return false;
    }